

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTruth.c
# Opt level: O3

Vec_Mem_t * If_DeriveHashTable6(int nVars,word uTruth)

{
  ulong uVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  int *__ptr;
  Vec_Mem_t *pVVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  int *piVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  word tCur;
  ulong local_88;
  uint local_7c;
  int *local_78;
  ulong local_70;
  Vec_Mem_t *local_68;
  word local_60;
  ulong local_58;
  ulong local_50;
  int *local_48;
  ulong local_40;
  ulong local_38;
  
  uVar14 = 1 << ((byte)nVars & 0x1f);
  local_60 = uTruth;
  uVar3 = Extra_Factorial(nVars);
  local_78 = Extra_GreyCodeSchedule(nVars);
  __ptr = Extra_PermSchedule(nVars);
  iVar9 = 1 << ((byte)nVars - 6 & 0x1f);
  if (nVars < 7) {
    iVar9 = 1;
  }
  local_40 = (ulong)(uint)nVars;
  pVVar5 = (Vec_Mem_t *)calloc(1,0x30);
  pVVar5->nEntrySize = iVar9;
  pVVar5->LogPageSze = 0xc;
  pVVar5->PageMask = 0xfff;
  pVVar5->iPage = -1;
  uVar11 = 9999;
  while( true ) {
    do {
      uVar10 = uVar11;
      uVar11 = uVar10 + 1;
    } while ((uVar10 & 1) != 0);
    if (uVar11 < 9) break;
    iVar9 = 5;
    while (uVar11 % (iVar9 - 2U) != 0) {
      uVar4 = iVar9 * iVar9;
      iVar9 = iVar9 + 2;
      if (uVar11 < uVar4) goto LAB_0043a396;
    }
  }
LAB_0043a396:
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  uVar4 = 0x10;
  if (0xe < uVar10) {
    uVar4 = uVar11;
  }
  pVVar6->nCap = uVar4;
  piVar7 = (int *)malloc((long)(int)uVar4 << 2);
  pVVar6->pArray = piVar7;
  pVVar6->nSize = uVar11;
  if (piVar7 != (int *)0x0) {
    memset(piVar7,0xff,(long)(int)uVar11 << 2);
  }
  pVVar5->vTable = pVVar6;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 10000;
  pVVar6->nSize = 0;
  piVar8 = (int *)malloc(40000);
  piVar7 = local_78;
  pVVar6->pArray = piVar8;
  pVVar5->vNexts = pVVar6;
  uVar13 = 1;
  if (1 < (int)uVar14) {
    uVar13 = (ulong)uVar14;
  }
  local_50 = (ulong)uVar3;
  uVar12 = CONCAT71((uint7)(uint3)(uVar3 >> 8),1);
  uVar15 = 0;
  local_68 = pVVar5;
  local_48 = __ptr;
  do {
    local_88 = uVar15 ^ local_60;
    if (0 < (int)uVar3) {
      local_7c = (uint)uVar12;
      uVar12 = 0;
      local_58 = local_88;
      do {
        local_70 = local_88;
        local_38 = uVar12;
        if ((int)local_40 != 0x1f) {
          uVar12 = 0;
          do {
            uVar15 = local_88;
            Vec_MemHashInsert(local_68,&local_88);
            bVar2 = (byte)(1L << ((byte)piVar7[uVar12] & 0x3f));
            local_88 = (s_Truths6[piVar7[uVar12]] & uVar15) >> (bVar2 & 0x3f) |
                       uVar15 << (bVar2 & 0x3f) & s_Truths6[piVar7[uVar12]];
            uVar12 = uVar12 + 1;
          } while (uVar13 != uVar12);
        }
        if (local_70 != local_88) {
          __assert_fail("tTemp2 == tCur",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTruth.c"
                        ,0x171,"Vec_Mem_t *If_DeriveHashTable6(int, word)");
        }
        iVar9 = local_48[local_38];
        bVar2 = (byte)(1L << ((byte)iVar9 & 0x3f));
        local_88 = (local_70 & s_PMasks[iVar9][2]) >> (bVar2 & 0x3f) |
                   (s_PMasks[iVar9][1] & local_70) << (bVar2 & 0x3f) | s_PMasks[iVar9][0] & local_70
        ;
        uVar12 = local_38 + 1;
      } while (uVar12 != local_50);
      uVar12 = (ulong)local_7c;
      __ptr = local_48;
      if (local_58 != local_88) {
        __assert_fail("tTemp1 == tCur",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTruth.c"
                      ,0x174,"Vec_Mem_t *If_DeriveHashTable6(int, word)");
      }
    }
    uVar15 = 0xffffffffffffffff;
    uVar1 = uVar12 & 1;
    uVar12 = 0;
    if (uVar1 == 0) {
      if (local_78 != (int *)0x0) {
        free(local_78);
      }
      pVVar5 = local_68;
      if (__ptr != (int *)0x0) {
        free(__ptr);
      }
      return pVVar5;
    }
  } while( true );
}

Assistant:

Vec_Mem_t * If_DeriveHashTable6( int nVars, word uTruth )
{
    int fVerbose = 0;
    int nMints   = (1 << nVars);
    int nPerms   = Extra_Factorial( nVars );
    int * pComp  = Extra_GreyCodeSchedule( nVars );
    int * pPerm  = Extra_PermSchedule( nVars );
    word Canon   = ABC_CONST(0xFFFFFFFFFFFFFFFF);
    word tCur, tTemp1, tTemp2;
    Vec_Mem_t * vTtMem6 = Vec_MemAllocForTTSimple( nVars );
    int i, p, c;
    for ( i = 0; i < 2; i++ )
    {
        tCur = i ? ~uTruth : uTruth;
        tTemp1 = tCur;
        for ( p = 0; p < nPerms; p++ )
        {
            tTemp2 = tCur;
            for ( c = 0; c < nMints; c++ )
            {
                if ( Canon > tCur )
                    Canon = tCur;
                Vec_MemHashInsert( vTtMem6, &tCur );
                tCur = Abc_Tt6Flip( tCur, pComp[c] );
            }
            assert( tTemp2 == tCur );
            tCur = Abc_Tt6SwapAdjacent( tCur, pPerm[p] );
        }
        assert( tTemp1 == tCur );
    }
    ABC_FREE( pComp );
    ABC_FREE( pPerm );
    if ( fVerbose )
    {
/*
        word * pEntry;
        Vec_MemForEachEntry( vTtMem6, pEntry, i )
        {
            Extra_PrintHex( stdout, (unsigned*)pEntry, nVars );  
            printf( ", " );
            if ( i % 4 == 3 )
                printf( "\n" );
        }
*/
        Extra_PrintHex( stdout, (unsigned*)&uTruth, nVars );  printf( "\n" );
        Extra_PrintHex( stdout, (unsigned*)&Canon,  nVars );  printf( "\n" );
        printf( "Members = %d.\n", Vec_MemEntryNum(vTtMem6) );
    }
    return vTtMem6;
}